

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::ShaderCompilerCase::setShaderSources
          (ShaderCompilerCase *this,deUint32 vertShader,deUint32 fragShader,ProgramContext *progCtx)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined8 local_38;
  char *fragShaderSourceCStr;
  char *vertShaderSourceCStr;
  Functions *gl;
  ProgramContext *progCtx_local;
  deUint32 fragShader_local;
  deUint32 vertShader_local;
  ShaderCompilerCase *this_local;
  
  gl = (Functions *)progCtx;
  progCtx_local._0_4_ = fragShader;
  progCtx_local._4_4_ = vertShader;
  _fragShader_local = this;
  pRVar2 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  vertShaderSourceCStr = (char *)CONCAT44(extraout_var,iVar1);
  fragShaderSourceCStr = (char *)std::__cxx11::string::c_str();
  local_38 = std::__cxx11::string::c_str();
  (**(code **)(vertShaderSourceCStr + 0x12b8))(progCtx_local._4_4_,1,&fragShaderSourceCStr,0);
  (**(code **)(vertShaderSourceCStr + 0x12b8))((deUint32)progCtx_local,1,&local_38,0);
  return;
}

Assistant:

void ShaderCompilerCase::setShaderSources (deUint32 vertShader, deUint32 fragShader, const ProgramContext& progCtx) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	const char* vertShaderSourceCStr = progCtx.vertShaderSource.c_str();
	const char* fragShaderSourceCStr = progCtx.fragShaderSource.c_str();
	gl.shaderSource(vertShader, 1, &vertShaderSourceCStr, DE_NULL);
	gl.shaderSource(fragShader, 1, &fragShaderSourceCStr, DE_NULL);
}